

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetArrayType
          (InterfaceVariableScalarReplacement *this,uint32_t elem_type_id,uint32_t array_length)

{
  uint32_t uVar1;
  TypeManager *pTVar2;
  Type *type;
  ConstantManager *this_00;
  Array array_type;
  undefined4 local_a0;
  uint32_t local_9c;
  undefined1 local_98 [8];
  pointer local_90;
  pointer puStack_88;
  pointer local_80;
  Array local_78;
  
  pTVar2 = IRContext::get_type_mgr((this->super_Pass).context_);
  type = analysis::TypeManager::GetType(pTVar2,elem_type_id);
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  local_98._0_4_ = analysis::ConstantManager::GetUIntConstId(this_00,array_length);
  local_a0 = 0;
  local_90 = (pointer)0x0;
  puStack_88 = (pointer)0x0;
  local_80 = (pointer)0x0;
  local_9c = array_length;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_90,&local_a0);
  analysis::Array::Array(&local_78,type,(LengthInfo *)local_98);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
  pTVar2 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = analysis::TypeManager::GetTypeInstruction(pTVar2,&local_78.super_Type);
  analysis::Array::~Array(&local_78);
  return uVar1;
}

Assistant:

uint32_t InterfaceVariableScalarReplacement::GetArrayType(
    uint32_t elem_type_id, uint32_t array_length) {
  analysis::Type* elem_type = context()->get_type_mgr()->GetType(elem_type_id);
  uint32_t array_length_id =
      context()->get_constant_mgr()->GetUIntConstId(array_length);
  analysis::Array array_type(
      elem_type,
      analysis::Array::LengthInfo{array_length_id, {0, array_length}});
  return context()->get_type_mgr()->GetTypeInstruction(&array_type);
}